

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

mat4 * mat4_inverse(mat4 m)

{
  mat4 *in_RDI;
  float fVar1;
  float in_stack_00000008;
  float in_stack_0000000c;
  float a15;
  float a14;
  float a13;
  float a12;
  float a11;
  float a10;
  float a9;
  float a8;
  float a7;
  float a6;
  float a5;
  float a4;
  float a3;
  float a2;
  float a1;
  float a0;
  float det;
  float *a;
  
  fVar1 = -(m.m[1] * m.m[4] * m.m[6]) * m.m[0xb] +
          -(m.m[1] * m.m[3] * m.m[8]) * m.m[10] +
          -(m.m[1] * m.m[2] * m.m[7]) * m.m[0xc] +
          -(m.m[0] * m.m[5] * m.m[7]) * m.m[10] +
          -(m.m[0] * m.m[3] * m.m[6]) * m.m[0xd] +
          -(m.m[0] * m.m[2] * m.m[9]) * m.m[0xb] +
          -(in_stack_0000000c * m.m[5] * m.m[6]) * m.m[0xc] +
          -(in_stack_0000000c * m.m[4] * m.m[9]) * m.m[10] +
          -(in_stack_0000000c * m.m[2] * m.m[8]) * m.m[0xd] +
          -(in_stack_00000008 * m.m[5] * m.m[8]) * m.m[0xb] +
          -(in_stack_00000008 * m.m[4] * m.m[7]) * m.m[0xd] +
          -(in_stack_00000008 * m.m[3] * m.m[9]) * m.m[0xc] +
          m.m[1] * m.m[4] * m.m[7] * m.m[10] +
          m.m[1] * m.m[3] * m.m[6] * m.m[0xc] +
          m.m[1] * m.m[2] * m.m[8] * m.m[0xb] +
          m.m[0] * m.m[5] * m.m[6] * m.m[0xb] +
          m.m[0] * m.m[3] * m.m[9] * m.m[10] +
          m.m[0] * m.m[2] * m.m[7] * m.m[0xd] +
          in_stack_0000000c * m.m[5] * m.m[8] * m.m[10] +
          in_stack_0000000c * m.m[4] * m.m[6] * m.m[0xd] +
          in_stack_0000000c * m.m[2] * m.m[9] * m.m[0xc] +
          in_stack_00000008 * m.m[5] * m.m[7] * m.m[0xc] +
          in_stack_00000008 * m.m[3] * m.m[8] * m.m[0xd] +
          in_stack_00000008 * m.m[4] * m.m[9] * m.m[0xb];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    mat4_create(in_RDI,(-(m.m[5] * m.m[8]) * m.m[0xb] +
                       -(m.m[4] * m.m[7]) * m.m[0xd] +
                       -(m.m[3] * m.m[9]) * m.m[0xc] +
                       m.m[5] * m.m[7] * m.m[0xc] +
                       m.m[3] * m.m[8] * m.m[0xd] + m.m[4] * m.m[9] * m.m[0xb]) / fVar1,
                (-(m.m[1] * m.m[7]) * m.m[0xc] +
                -(m.m[0] * m.m[9]) * m.m[0xb] +
                -(in_stack_0000000c * m.m[8]) * m.m[0xd] +
                m.m[1] * m.m[8] * m.m[0xb] +
                in_stack_0000000c * m.m[9] * m.m[0xc] + m.m[0] * m.m[7] * m.m[0xd]) / fVar1,
                (-(m.m[1] * m.m[4]) * m.m[0xb] +
                -(m.m[0] * m.m[3]) * m.m[0xd] +
                -(in_stack_0000000c * m.m[5]) * m.m[0xc] +
                m.m[1] * m.m[3] * m.m[0xc] +
                in_stack_0000000c * m.m[4] * m.m[0xd] + m.m[0] * m.m[5] * m.m[0xb]) / fVar1,
                (-(m.m[1] * m.m[3]) * m.m[8] +
                -(m.m[0] * m.m[5]) * m.m[7] +
                -(in_stack_0000000c * m.m[4]) * m.m[9] +
                m.m[1] * m.m[4] * m.m[7] +
                in_stack_0000000c * m.m[5] * m.m[8] + m.m[0] * m.m[3] * m.m[9]) / fVar1,
                (-(m.m[5] * m.m[6]) * m.m[0xc] +
                -(m.m[4] * m.m[9]) * m.m[10] +
                -(m.m[2] * m.m[8]) * m.m[0xd] +
                m.m[5] * m.m[8] * m.m[10] + m.m[2] * m.m[9] * m.m[0xc] + m.m[4] * m.m[6] * m.m[0xd])
                / fVar1,(-(m.m[1] * m.m[8]) * m.m[10] +
                        -(m.m[0] * m.m[6]) * m.m[0xd] +
                        -(in_stack_00000008 * m.m[9]) * m.m[0xc] +
                        m.m[1] * m.m[6] * m.m[0xc] +
                        in_stack_00000008 * m.m[8] * m.m[0xd] + m.m[0] * m.m[9] * m.m[10]) / fVar1,
                (-(m.m[1] * m.m[2]) * m.m[0xc] +
                -(m.m[0] * m.m[5]) * m.m[10] +
                -(in_stack_00000008 * m.m[4]) * m.m[0xd] +
                m.m[1] * m.m[4] * m.m[10] +
                in_stack_00000008 * m.m[5] * m.m[0xc] + m.m[0] * m.m[2] * m.m[0xd]) / fVar1,
                (-(m.m[1] * m.m[4]) * m.m[6] +
                -(m.m[0] * m.m[2]) * m.m[9] +
                -(in_stack_00000008 * m.m[5]) * m.m[8] +
                m.m[1] * m.m[2] * m.m[8] +
                in_stack_00000008 * m.m[4] * m.m[9] + m.m[0] * m.m[5] * m.m[6]) / fVar1,
                (-(m.m[5] * m.m[7]) * m.m[10] +
                -(m.m[3] * m.m[6]) * m.m[0xd] +
                -(m.m[2] * m.m[9]) * m.m[0xb] +
                m.m[5] * m.m[6] * m.m[0xb] + m.m[2] * m.m[7] * m.m[0xd] + m.m[3] * m.m[9] * m.m[10])
                / fVar1,(-(m.m[1] * m.m[6]) * m.m[0xb] +
                        -(in_stack_0000000c * m.m[9]) * m.m[10] +
                        -(in_stack_00000008 * m.m[7]) * m.m[0xd] +
                        m.m[1] * m.m[7] * m.m[10] +
                        in_stack_00000008 * m.m[9] * m.m[0xb] +
                        in_stack_0000000c * m.m[6] * m.m[0xd]) / fVar1,
                (-(m.m[1] * m.m[3]) * m.m[10] +
                -(in_stack_0000000c * m.m[2]) * m.m[0xd] +
                -(in_stack_00000008 * m.m[5]) * m.m[0xb] +
                m.m[1] * m.m[2] * m.m[0xb] +
                in_stack_00000008 * m.m[3] * m.m[0xd] + in_stack_0000000c * m.m[5] * m.m[10]) /
                fVar1,(-(m.m[1] * m.m[2]) * m.m[7] +
                      -(in_stack_0000000c * m.m[5]) * m.m[6] +
                      -(in_stack_00000008 * m.m[3]) * m.m[9] +
                      m.m[1] * m.m[3] * m.m[6] +
                      in_stack_00000008 * m.m[5] * m.m[7] + in_stack_0000000c * m.m[2] * m.m[9]) /
                      fVar1,
                (-(m.m[4] * m.m[6]) * m.m[0xb] +
                -(m.m[3] * m.m[8]) * m.m[10] +
                -(m.m[2] * m.m[7]) * m.m[0xc] +
                m.m[4] * m.m[7] * m.m[10] + m.m[2] * m.m[8] * m.m[0xb] + m.m[3] * m.m[6] * m.m[0xc])
                / fVar1,(-(m.m[0] * m.m[7]) * m.m[10] +
                        -(in_stack_0000000c * m.m[6]) * m.m[0xc] +
                        -(in_stack_00000008 * m.m[8]) * m.m[0xb] +
                        m.m[0] * m.m[6] * m.m[0xb] +
                        in_stack_00000008 * m.m[7] * m.m[0xc] + in_stack_0000000c * m.m[8] * m.m[10]
                        ) / fVar1,
                (-(m.m[0] * m.m[2]) * m.m[0xb] +
                -(in_stack_0000000c * m.m[4]) * m.m[10] +
                -(in_stack_00000008 * m.m[3]) * m.m[0xc] +
                m.m[0] * m.m[3] * m.m[10] +
                in_stack_00000008 * m.m[4] * m.m[0xb] + in_stack_0000000c * m.m[2] * m.m[0xc]) /
                fVar1,(-(m.m[0] * m.m[3]) * m.m[6] +
                      -(in_stack_0000000c * m.m[2]) * m.m[8] +
                      -(in_stack_00000008 * m.m[4]) * m.m[7] +
                      m.m[0] * m.m[2] * m.m[7] +
                      in_stack_00000008 * m.m[3] * m.m[8] + in_stack_0000000c * m.m[4] * m.m[6]) /
                      fVar1);
  }
  else {
    mat4_identity();
  }
  return in_RDI;
}

Assistant:

mat4 mat4_inverse(mat4 m) {
    float *a = m.m;

    float det =
        a[0] * a[5] * a[10] * a[15] +
        a[0] * a[6] * a[11] * a[13] +
        a[0] * a[7] * a[9] * a[14] +

        a[1] * a[4] * a[11] * a[14] +
        a[1] * a[6] * a[8] * a[15] +
        a[1] * a[7] * a[10] * a[12] +

        a[2] * a[4] * a[9] * a[15] +
        a[2] * a[5] * a[11] * a[12] +
        a[2] * a[7] * a[8] * a[13] +

        a[3] * a[4] * a[10] * a[13] +
        a[3] * a[5] * a[8] * a[14] +
        a[3] * a[6] * a[9] * a[12] -

        a[0] * a[5] * a[11] * a[14] -
        a[0] * a[6] * a[9] * a[15] -
        a[0] * a[7] * a[10] * a[13] -

        a[1] * a[4] * a[10] * a[15] -
        a[1] * a[6] * a[11] * a[12] -
        a[1] * a[7] * a[8] * a[14] -

        a[2] * a[4] * a[11] * a[13] -
        a[2] * a[5] * a[8] * a[15] -
        a[2] * a[7] * a[9] * a[12] -

        a[3] * a[4] * a[9] * a[14] -
        a[3] * a[5] * a[10] * a[12] -
        a[3] * a[6] * a[8] * a[13];

    if (det == 0.0) {
        return mat4_identity();
    }

    float a0 = a[5] * a[10] * a[15] + a[6] * a[11] * a[13] + a[7] * a[9] * a[14] - a[5] * a[11] * a[14] - a[6] * a[9] * a[15] - a[7] * a[10] * a[13];

    float a1 = a[1] * a[11] * a[14] + a[2] * a[9] * a[15] + a[3] * a[10] * a[13] - a[1] * a[10] * a[15] - a[2] * a[11] * a[13] - a[3] * a[9] * a[14];

    float a2 = a[1] * a[6] * a[15] + a[2] * a[7] * a[13] + a[3] * a[5] * a[14] - a[1] * a[7] * a[14] - a[2] * a[5] * a[15] - a[3] * a[6] * a[13];

    float a3 = a[1] * a[7] * a[10] + a[2] * a[5] * a[11] + a[3] * a[6] * a[9] - a[1] * a[6] * a[11] - a[2] * a[7] * a[9] - a[3] * a[5] * a[10];

    float a4 = a[4] * a[11] * a[14] + a[6] * a[8] * a[15] + a[7] * a[10] * a[12] - a[4] * a[10] * a[15] - a[6] * a[11] * a[12] - a[7] * a[8] * a[14];

    float a5 = a[0] * a[10] * a[15] + a[2] * a[11] * a[12] + a[3] * a[8] * a[14] - a[0] * a[11] * a[14] - a[2] * a[8] * a[15] - a[3] * a[10] * a[12];

    float a6 = a[0] * a[7] * a[14] + a[2] * a[4] * a[15] + a[3] * a[6] * a[12] - a[0] * a[6] * a[15] - a[2] * a[7] * a[12] - a[3] * a[4] * a[14];

    float a7 = a[0] * a[6] * a[11] + a[2] * a[7] * a[8] + a[3] * a[4] * a[10] - a[0] * a[7] * a[10] - a[2] * a[4] * a[11] - a[3] * a[6] * a[8];

    float a8 = a[4] * a[9] * a[15] + a[5] * a[11] * a[12] + a[7] * a[8] * a[13] - a[4] * a[11] * a[13] - a[5] * a[8] * a[15] - a[7] * a[9] * a[12];

    float a9 = a[0] * a[11] * a[13] + a[1] * a[8] * a[15] + a[3] * a[9] * a[12] - a[0] * a[9] * a[15] - a[1] * a[11] * a[12] - a[3] * a[8] * a[13];

    float a10 = a[0] * a[5] * a[15] + a[1] * a[7] * a[12] + a[3] * a[4] * a[13] - a[0] * a[7] * a[13] - a[1] * a[4] * a[15] - a[3] * a[5] * a[12];

    float a11 = a[0] * a[7] * a[9] + a[1] * a[4] * a[11] + a[3] * a[5] * a[8] - a[0] * a[5] * a[11] - a[1] * a[7] * a[8] - a[3] * a[4] * a[9];

    float a12 = a[4] * a[10] * a[13] + a[5] * a[8] * a[14] + a[6] * a[9] * a[12] - a[4] * a[9] * a[14] - a[5] * a[10] * a[12] - a[6] * a[8] * a[13];

    float a13 = a[0] * a[9] * a[14] + a[1] * a[10] * a[12] + a[2] * a[8] * a[13] - a[0] * a[10] * a[13] - a[1] * a[8] * a[14] - a[2] * a[9] * a[12];

    float a14 = a[0] * a[6] * a[13] + a[1] * a[4] * a[14] + a[2] * a[5] * a[12] - a[0] * a[5] * a[14] - a[1] * a[6] * a[12] - a[2] * a[4] * a[13];

    float a15 = a[0] * a[5] * a[10] + a[1] * a[6] * a[8] + a[2] * a[4] * a[9] - a[0] * a[6] * a[9] - a[1] * a[4] * a[10] - a[2] * a[5] * a[8];

    return mat4_create(
            a0 / det, a1 / det, a2 / det, a3 / det,
            a4 / det, a5 / det, a6 / det, a7 / det,
            a8 / det, a9 / det, a10 / det, a11 / det,
            a12 / det, a13 / det, a14 / det, a15 / det);
}